

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O0

void __thiscall
cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
          (cmOrderDirectoriesConstraintSOName *this,cmOrderDirectories *od,string *file,char *soname
          )

{
  bool bVar1;
  ulong uVar2;
  char *local_78;
  undefined1 local_60 [8];
  string soguess;
  allocator<char> local_29;
  char *local_28;
  char *soname_local;
  string *file_local;
  cmOrderDirectories *od_local;
  cmOrderDirectoriesConstraintSOName *this_local;
  
  local_28 = soname;
  soname_local = (char *)file;
  file_local = (string *)od;
  od_local = (cmOrderDirectories *)this;
  cmOrderDirectoriesConstraint::cmOrderDirectoriesConstraint
            (&this->super_cmOrderDirectoriesConstraint,od,file);
  (this->super_cmOrderDirectoriesConstraint)._vptr_cmOrderDirectoriesConstraint =
       (_func_int **)&PTR__cmOrderDirectoriesConstraintSOName_009dbd88;
  if (local_28 == (char *)0x0) {
    local_78 = "";
  }
  else {
    local_78 = local_28;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->SOName,local_78,&local_29);
  std::allocator<char>::~allocator(&local_29);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::string((string *)local_60);
    bVar1 = cmSystemTools::GuessLibrarySOName((string *)soname_local,(string *)local_60);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)&this->SOName,(string *)local_60);
    }
    std::__cxx11::string::~string((string *)local_60);
  }
  return;
}

Assistant:

cmOrderDirectoriesConstraintSOName(cmOrderDirectories* od,
                                     std::string const& file,
                                     const char* soname)
    : cmOrderDirectoriesConstraint(od, file)
    , SOName(soname ? soname : "")
  {
    if (this->SOName.empty()) {
      // Try to guess the soname.
      std::string soguess;
      if (cmSystemTools::GuessLibrarySOName(file, soguess)) {
        this->SOName = soguess;
      }
    }
  }